

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Update_Doctors_Time_Table_File
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Doctors_Timetable,ofstream *inFile)

{
  long lVar1;
  long lVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ofstream abus;
  undefined1 local_239;
  long local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  system("pause");
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x129191);
  lVar6 = 0;
  do {
    lVar8 = 0;
    local_238 = lVar6;
    do {
      lVar1 = *(long *)&(Doctors_Timetable->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      local_239 = 0x20;
      _Var4 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (*(char **)(lVar1 + lVar8),
                         *(char **)(lVar1 + lVar8) + *(long *)(lVar1 + 8 + lVar8),
                         (_Iter_equals_val<const_char>)&local_239);
      lVar2 = *(long *)&(Doctors_Timetable->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar3 = *(long *)(lVar1 + lVar8);
      uVar7 = (long)_Var4._M_current - lVar3;
      if (*(long *)(lVar1 + 8 + lVar8) + lVar3 ==
          *(long *)(lVar2 + lVar8) + *(long *)(lVar2 + 8 + lVar8)) {
        *(ulong *)(lVar1 + 8 + lVar8) = uVar7;
        *(undefined1 *)(lVar3 + uVar7) = 0;
      }
      else {
        std::__cxx11::string::_M_erase(lVar1 + lVar8,uVar7);
      }
      lVar1 = *(long *)&(Doctors_Timetable->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,*(char **)(lVar1 + lVar8),
                          *(long *)(lVar1 + 8 + lVar8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0xc0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    lVar6 = local_238 + 1;
  } while (lVar6 != 7);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Hospital:: Update_Doctors_Time_Table_File (vector<vector<string>> Doctors_Timetable , ofstream& inFile) {

    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Doctors_Timetable.txt");
    //abus <<"Asghar";

    for (int i = 0; i < 7; i++) {
        for (int j = 0; j < 6; ++j) {
            Doctors_Timetable[i][j] .erase(remove(Doctors_Timetable[i][j] .begin(), Doctors_Timetable[i][j] .end(), ' '), Doctors_Timetable[i][j] .end());
            //    Doctors_Timetable[i][j].erase(std::remove_if(Doctors_Timetable[i][j].begin(), Doctors_Timetable[i][j].end(), ::isspace), Doctors_Timetable[i][j].end());
                abus << Doctors_Timetable[i][j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}